

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall
test::iu_FilePath_x_iutest_x_RemoveTrailingPathSeparator_Test::
iu_FilePath_x_iutest_x_RemoveTrailingPathSeparator_Test
          (iu_FilePath_x_iutest_x_RemoveTrailingPathSeparator_Test *this)

{
  iu_FilePath_x_iutest_x_RemoveTrailingPathSeparator_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_FilePath_x_iutest_x_RemoveTrailingPathSeparator_Test_00620028;
  return;
}

Assistant:

IUTEST(FilePath, RemoveTrailingPathSeparator)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_EQ("", path.RemoveTrailingPathSeparator());
    }
    {
        ::iutest::internal::FilePath path("path/to/dir/////");
#ifdef IUTEST_OS_WINDOWS
        IUTEST_EXPECT_EQ("path\\to\\dir", path.RemoveTrailingPathSeparator());
#else
        IUTEST_EXPECT_EQ("path/to/dir", path.RemoveTrailingPathSeparator());
#endif
    }
}